

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O1

void printBDRAddrOperand(MCInst *MI,int OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  char *pcVar3;
  uint r;
  uint r_00;
  sysz_reg sVar4;
  MCOperand *pMVar5;
  ulong uVar6;
  
  pMVar5 = MCInst_getOperand(MI,OpNum);
  r = MCOperand_getReg(pMVar5);
  pMVar5 = MCInst_getOperand(MI,OpNum + 1);
  uVar6 = MCOperand_getImm(pMVar5);
  pMVar5 = MCInst_getOperand(MI,OpNum + 2);
  r_00 = MCOperand_getReg(pMVar5);
  pcVar3 = "#%lu";
  if (9 < uVar6) {
    pcVar3 = "#0x%lx";
  }
  SStream_concat(O,pcVar3 + 1,uVar6);
  SStream_concat0(O,"(");
  SStream_concat(O,"%%%s",getRegisterName_AsmStrs +
                          *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(r_00 - 1) * 2));
  if (r != 0) {
    SStream_concat(O,", %%%s",
                   getRegisterName_AsmStrs +
                   *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(r - 1) * 2));
  }
  SStream_concat0(O,")");
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    sVar4 = SystemZ_map_register(r);
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x1d] = (uint8_t)sVar4;
    sVar4 = SystemZ_map_register(r_00);
    pcVar2 = MI->flat_insn->detail;
    *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x25) =
         (ulong)(sVar4 & 0xff);
    pcVar2 = MI->flat_insn->detail;
    *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x2d) = uVar6;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printBDRAddrOperand(MCInst *MI, int OpNum, SStream *O)
{
	unsigned Base = MCOperand_getReg(MCInst_getOperand(MI, OpNum));
	uint64_t Disp = (uint64_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum + 1));
	uint64_t Length = MCOperand_getReg(MCInst_getOperand(MI, OpNum + 2));

	if (Disp > HEX_THRESHOLD)
		SStream_concat(O, "0x%"PRIx64, Disp);
	else
		SStream_concat(O, "%"PRIu64, Disp);

	SStream_concat0(O, "(");
	SStream_concat(O, "%%%s", getRegisterName(Length));

	if (Base)
		SStream_concat(O, ", %%%s", getRegisterName(Base));
	SStream_concat0(O, ")");

	if (MI->csh->detail) {
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_MEM;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.base = (uint8_t)SystemZ_map_register(Base);
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.length = (uint8_t)SystemZ_map_register(Length);
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.disp = (int64_t)Disp;
		MI->flat_insn->detail->sysz.op_count++;
	}
}